

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O3

void __thiscall CP::queue<int>::push(queue<int> *this,int *element)

{
  size_t sVar1;
  ulong uVar2;
  ulong capacity;
  ulong uVar3;
  
  uVar3 = this->mCap;
  sVar1 = this->mSize;
  uVar2 = sVar1 + 1;
  if (uVar3 < uVar2) {
    capacity = uVar3 * 2;
    if (uVar3 * 2 <= uVar2) {
      capacity = uVar2;
    }
    expand(this,capacity);
    uVar3 = this->mCap;
    sVar1 = this->mSize;
    uVar2 = sVar1 + 1;
  }
  this->mData[(sVar1 + this->mFront) % uVar3] = *element;
  this->mSize = uVar2;
  return;
}

Assistant:

void push(const T& element) {
      ensureCapacity(mSize+1);
      mData[(mFront + mSize) % mCap] = element;
      mSize++;
    }